

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O1

void __thiscall gl3cts::TextureSwizzle::SmokeTest::testInit(SmokeTest *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  GLint minor;
  GLint major;
  undefined8 local_28;
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  local_28 = 0;
  (**(code **)(lVar4 + 0x868))(0x821b,(long)&local_28 + 4);
  (**(code **)(lVar4 + 0x868))(0x821c,&local_28);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xe2b);
  if ((4 < local_28._4_4_) || ((local_28._4_4_ == 4 && (2 < (int)local_28)))) {
    this->m_is_ms_supported = true;
  }
  if (this->m_is_ms_supported == false) {
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_ARB_texture_storage_multisample");
    this->m_is_ms_supported = bVar1;
  }
  (**(code **)(lVar4 + 0x6d0))(1,&this->m_prepare_fbo_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"GenFramebuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xe48);
  (**(code **)(lVar4 + 0x6d0))(1,&this->m_test_fbo_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"GenFramebuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xe4b);
  (**(code **)(lVar4 + 0x708))(1,&this->m_vao_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"genVertexArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xe4f);
  (**(code **)(lVar4 + 0xd8))(this->m_vao_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"bindVertexArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xe52);
  return;
}

Assistant:

void SmokeTest::testInit()
{
	/*  */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint major = 0;
	glw::GLint minor = 0;

	gl.getIntegerv(GL_MAJOR_VERSION, &major);
	gl.getIntegerv(GL_MINOR_VERSION, &minor);

	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	if (4 < major)
	{
		m_is_ms_supported = true;
	}
	else if (4 == major)
	{
		if (3 <= minor)
		{
			m_is_ms_supported = true;
		}
	}

	/* Context is below 4.3 */
	if (false == m_is_ms_supported)
	{
		m_is_ms_supported = m_context.getContextInfo().isExtensionSupported("GL_ARB_texture_storage_multisample");
	}

#if ENABLE_DEBUG

	gl.debugMessageCallback(debug_proc, &m_context);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DebugMessageCallback");

#endif /* ENABLE_DEBUG */

	/* Prepare FBOs */
	gl.genFramebuffers(1, &m_prepare_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenFramebuffers");

	gl.genFramebuffers(1, &m_test_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenFramebuffers");

	/* Prepare blank VAO */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "genVertexArrays");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bindVertexArray");
}